

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

uint image_format_to_components(ImageFormat fmt)

{
  CompilerError *this;
  uint local_c;
  ImageFormat fmt_local;
  
  switch(fmt) {
  case ImageFormatUnknown:
    local_c = 4;
    break;
  case ImageFormatRgba32f:
  case ImageFormatRgba16f:
  case ImageFormatRgba8:
  case ImageFormatRgba8Snorm:
  case ImageFormatRgba16:
  case ImageFormatRgb10A2:
  case ImageFormatRgba16Snorm:
  case ImageFormatRgba32i:
  case ImageFormatRgba16i:
  case ImageFormatRgba8i:
  case ImageFormatRgba32ui:
  case ImageFormatRgba16ui:
  case ImageFormatRgba8ui:
  case ImageFormatRgb10a2ui:
    local_c = 4;
    break;
  case ImageFormatR32f:
  case ImageFormatR16f:
  case ImageFormatR16:
  case ImageFormatR8:
  case ImageFormatR16Snorm:
  case ImageFormatR8Snorm:
  case ImageFormatR32i:
  case ImageFormatR16i:
  case ImageFormatR8i:
  case ImageFormatR32ui:
  case ImageFormatR16ui:
  case ImageFormatR8ui:
    local_c = 1;
    break;
  case ImageFormatRg32f:
  case ImageFormatRg16f:
  case ImageFormatRg16:
  case ImageFormatRg8:
  case ImageFormatRg16Snorm:
  case ImageFormatRg8Snorm:
  case ImageFormatRg32i:
  case ImageFormatRg16i:
  case ImageFormatRg8i:
  case ImageFormatRg32ui:
  case ImageFormatRg16ui:
  case ImageFormatRg8ui:
    local_c = 2;
    break;
  case ImageFormatR11fG11fB10f:
    local_c = 3;
    break;
  default:
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(this,"Unrecognized typed image format.");
    __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,
                spirv_cross::CompilerError::~CompilerError);
  }
  return local_c;
}

Assistant:

static unsigned image_format_to_components(ImageFormat fmt)
{
	switch (fmt)
	{
	case ImageFormatR8:
	case ImageFormatR16:
	case ImageFormatR8Snorm:
	case ImageFormatR16Snorm:
	case ImageFormatR16f:
	case ImageFormatR32f:
	case ImageFormatR8i:
	case ImageFormatR16i:
	case ImageFormatR32i:
	case ImageFormatR8ui:
	case ImageFormatR16ui:
	case ImageFormatR32ui:
		return 1;

	case ImageFormatRg8:
	case ImageFormatRg16:
	case ImageFormatRg8Snorm:
	case ImageFormatRg16Snorm:
	case ImageFormatRg16f:
	case ImageFormatRg32f:
	case ImageFormatRg8i:
	case ImageFormatRg16i:
	case ImageFormatRg32i:
	case ImageFormatRg8ui:
	case ImageFormatRg16ui:
	case ImageFormatRg32ui:
		return 2;

	case ImageFormatR11fG11fB10f:
		return 3;

	case ImageFormatRgba8:
	case ImageFormatRgba16:
	case ImageFormatRgb10A2:
	case ImageFormatRgba8Snorm:
	case ImageFormatRgba16Snorm:
	case ImageFormatRgba16f:
	case ImageFormatRgba32f:
	case ImageFormatRgba8i:
	case ImageFormatRgba16i:
	case ImageFormatRgba32i:
	case ImageFormatRgba8ui:
	case ImageFormatRgba16ui:
	case ImageFormatRgba32ui:
	case ImageFormatRgb10a2ui:
		return 4;

	case ImageFormatUnknown:
		return 4; // Assume 4.

	default:
		SPIRV_CROSS_THROW("Unrecognized typed image format.");
	}
}